

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_pad(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  undefined4 *puVar14;
  char *pcVar15;
  long lVar16;
  long lVar17;
  undefined8 uVar18;
  undefined4 *puVar19;
  undefined4 *puVar20;
  undefined4 *puVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int64_t i3;
  long lVar25;
  ulong uVar26;
  int64_t i1;
  long lVar27;
  int64_t i0;
  ulong uVar28;
  ulong uVar29;
  undefined4 uVar30;
  
  pgVar1 = dst->src[0];
  if (pgVar1->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1a0a,"fatal error");
  }
  if (pgVar1->nb[0] == 4) {
    if (dst->nb[0] == 4) {
      lVar2 = pgVar1->ne[2];
      lVar22 = (long)params->ith;
      lVar25 = (long)params->nth;
      lVar3 = pgVar1->ne[1];
      uVar4 = dst->ne[0];
      lVar5 = pgVar1->ne[0];
      sVar6 = pgVar1->nb[1];
      lVar7 = dst->ne[1];
      uVar8 = dst->ne[2];
      lVar9 = pgVar1->ne[3];
      sVar10 = pgVar1->nb[3];
      uVar11 = dst->ne[3];
      lVar13 = sVar6 * lVar22;
      sVar12 = pgVar1->nb[2];
      puVar19 = (undefined4 *)(uVar4 * lVar22 * 4 + (long)dst->data);
      lVar17 = lVar7 * uVar4;
      for (uVar29 = 0; puVar20 = puVar19, lVar23 = lVar13, lVar27 = lVar22,
          uVar29 != (~((long)uVar8 >> 0x3f) & uVar8); uVar29 = uVar29 + 1) {
        for (; lVar27 < lVar7; lVar27 = lVar27 + lVar25) {
          puVar21 = puVar20;
          lVar24 = lVar23;
          for (uVar28 = 0; uVar28 != (~((long)uVar4 >> 0x3f) & uVar4); uVar28 = uVar28 + 1) {
            puVar14 = puVar21;
            lVar16 = lVar24;
            for (uVar26 = 0; (~((long)uVar11 >> 0x3f) & uVar11) != uVar26; uVar26 = uVar26 + 1) {
              uVar30 = 0;
              if ((long)uVar26 < lVar9 &&
                  (((long)uVar28 < lVar5 && lVar27 < lVar3) && (long)uVar29 < lVar2)) {
                uVar30 = *(undefined4 *)((long)pgVar1->data + lVar16);
              }
              *puVar14 = uVar30;
              lVar16 = lVar16 + sVar10;
              puVar14 = puVar14 + lVar17 * uVar8;
            }
            lVar24 = lVar24 + 4;
            puVar21 = puVar21 + 1;
          }
          puVar20 = puVar20 + uVar4 * lVar25;
          lVar23 = lVar23 + sVar6 * lVar25;
        }
        lVar13 = lVar13 + sVar12;
        puVar19 = puVar19 + lVar17;
      }
      return;
    }
    pcVar15 = "dst->nb[0] == sizeof(float)";
    uVar18 = 0x19df;
  }
  else {
    pcVar15 = "src0->nb[0] == sizeof(float)";
    uVar18 = 0x19de;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar18,"GGML_ASSERT(%s) failed",pcVar15);
}

Assistant:

void ggml_compute_forward_pad(
    const ggml_compute_params * params,
    ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_pad_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}